

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionAlgorithmsBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::cbtCapsuleBoxCollisionAlgorithm::processCollision
          (cbtCapsuleBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0,
          cbtCollisionObjectWrapper *body1,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  float fVar4;
  int iVar5;
  cbtCollisionShape *pcVar6;
  cbtTransform *pcVar7;
  cbtCollisionShape *pcVar8;
  cbtTransform *pcVar9;
  cbtPersistentManifold *this_00;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  pointer pfVar14;
  bool bVar15;
  cbtCollisionObjectWrapper *pcVar16;
  cbtCollisionObject *pcVar17;
  cbtCollisionObject *pcVar18;
  int i;
  long lVar19;
  pointer pfVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> t_points;
  cbtScalar tMax;
  cbtScalar tMin;
  cbtVector3 a;
  cbtVector3 c1;
  cbtVector3 c2;
  cbtVector3 hdims;
  float local_120;
  float local_11c;
  vector<float,_std::allocator<float>_> local_118;
  float local_fc;
  cbtVector3 local_f8;
  undefined1 local_e8 [16];
  float local_cc;
  float local_c8;
  float local_c4;
  cbtScalar local_c0;
  cbtScalar local_bc;
  undefined1 local_b8 [16];
  cbtManifoldResult *local_a8;
  cbtVector3 local_a0;
  float local_8c;
  cbtVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  cbtCapsuleBoxCollisionAlgorithm *local_58;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  local_f8.m_floats._8_8_ = local_f8.m_floats._0_8_;
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    pcVar16 = body1;
    if (this->m_isSwapped != false) {
      pcVar16 = body0;
      body0 = body1;
    }
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    pcVar6 = body0->m_shape;
    pcVar7 = body0->m_worldTransform;
    pcVar8 = pcVar16->m_shape;
    pcVar9 = pcVar16->m_worldTransform;
    fVar23 = (pcVar7->m_origin).m_floats[0] - (pcVar9->m_origin).m_floats[0];
    fVar10 = (pcVar7->m_origin).m_floats[1] - (pcVar9->m_origin).m_floats[1];
    fVar11 = (pcVar7->m_origin).m_floats[2] - (pcVar9->m_origin).m_floats[2];
    fVar22 = (pcVar9->m_basis).m_el[1].m_floats[0];
    cVar1 = (pcVar7->m_basis).m_el[0].m_floats[1];
    fVar2 = (pcVar7->m_basis).m_el[1].m_floats[1];
    auVar25 = ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[0]);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar2)),auVar25,ZEXT416((uint)cVar1));
    cVar3 = (pcVar7->m_basis).m_el[2].m_floats[1];
    auVar26 = ZEXT416((uint)(pcVar9->m_basis).m_el[2].m_floats[0]);
    auVar21 = vfmadd231ss_fma(auVar21,auVar26,ZEXT416((uint)cVar3));
    fVar27 = (pcVar9->m_basis).m_el[1].m_floats[1];
    auVar28 = ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[1]);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar2)),auVar28,ZEXT416((uint)cVar1));
    auVar29 = ZEXT416((uint)(pcVar9->m_basis).m_el[2].m_floats[1]);
    auVar13 = vfmadd231ss_fma(auVar13,auVar29,ZEXT416((uint)cVar3));
    auVar21 = vinsertps_avx(auVar21,auVar13,0x10);
    fVar4 = (pcVar9->m_basis).m_el[1].m_floats[2];
    auVar30 = ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[2]);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar2)),auVar30,ZEXT416((uint)cVar1));
    auVar31 = ZEXT416((uint)(pcVar9->m_basis).m_el[2].m_floats[2]);
    auVar13 = vfmadd231ss_fma(auVar13,auVar31,ZEXT416((uint)cVar3));
    local_a0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,auVar13,0x28);
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar22)),ZEXT416((uint)fVar23),auVar25);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar11),auVar26);
    local_c4 = auVar21._0_4_;
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar10)),ZEXT416((uint)fVar23),auVar28);
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar11),auVar29);
    local_c8 = auVar21._0_4_;
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar10)),auVar30,ZEXT416((uint)fVar23));
    auVar21 = vfmadd231ss_fma(auVar21,auVar31,ZEXT416((uint)fVar11));
    local_cc = auVar21._0_4_;
    local_b8._8_8_ = 0;
    local_b8._0_8_ = *(ulong *)&pcVar8[1].field_0xc;
    uVar24 = *(ulong *)((long)&pcVar8[1].m_userPointer + 4);
    local_e8._8_8_ = 0;
    local_e8._0_8_ = uVar24;
    local_a8 = resultOut;
    local_58 = this;
    (*pcVar8->_vptr_cbtCollisionShape[0xc])(pcVar8);
    fVar22 = (float)uVar24;
    local_11c = fVar22;
    (*pcVar8->_vptr_cbtCollisionShape[0xc])(pcVar8);
    local_fc = fVar22;
    (*pcVar8->_vptr_cbtCollisionShape[0xc])(pcVar8);
    auVar21 = vmovshdup_avx(local_b8);
    auVar21 = vinsertps_avx(ZEXT416((uint)(local_b8._0_4_ + local_11c)),
                            ZEXT416((uint)(auVar21._0_4_ + local_fc)),0x10);
    auVar13 = vinsertps_avx(ZEXT416((uint)(local_e8._0_4_ + fVar22)),local_e8,0x5c);
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21,auVar13);
    iVar5 = *(int *)((long)&pcVar6[2]._vptr_cbtCollisionShape + 4);
    local_11c = *(float *)(&pcVar6[1].field_0xc + (long)((iVar5 + 2) % 3) * 4);
    local_f8.m_floats[1] = *(cbtScalar *)(&pcVar6[1].field_0xc + (long)iVar5 * 4);
    local_fc = (local_f8.m_floats[1] + local_f8.m_floats[1]) * 0.0001;
    auVar21._8_4_ = 0x80000000;
    auVar21._0_8_ = 0x8000000080000000;
    auVar21._12_4_ = 0x80000000;
    local_e8 = ZEXT416((uint)local_f8.m_floats[1]);
    local_b8 = vxorps_avx512vl(local_e8,auVar21);
    local_f8.m_floats[0] = local_b8._0_4_;
    __l._M_len = 2;
    __l._M_array = local_f8.m_floats;
    std::vector<float,_std::allocator<float>_>::vector(&local_118,__l,(allocator_type *)&local_88);
    lVar19 = 0;
    do {
      local_f8.m_floats = (cbtScalar  [4])ZEXT816(0);
      local_f8.m_floats[lVar19] = 1.0;
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl(ZEXT416((uint)(local_a0.m_floats[lVar19] + -1.0)),auVar13);
      if (1e-05 <= auVar21._0_4_) {
        auVar21 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[0] * local_f8.m_floats[1])),
                                  ZEXT416((uint)local_f8.m_floats[0]),
                                  ZEXT416((uint)local_a0.m_floats[1]));
        auVar13 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[2] * local_f8.m_floats[0])),
                                  ZEXT416((uint)local_f8.m_floats[2]),
                                  ZEXT416((uint)local_a0.m_floats[0]));
        auVar26 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[1] * local_f8.m_floats[2])),
                                  ZEXT416((uint)local_a0.m_floats[2]),
                                  ZEXT416((uint)local_f8.m_floats[1]));
        auVar25 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[1] * auVar21._0_4_)),auVar13,
                                  ZEXT416((uint)local_a0.m_floats[2]));
        auVar21 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[2] * auVar26._0_4_)),
                                  ZEXT416((uint)local_a0.m_floats[0]),auVar21);
        auVar13 = vfmsub231ss_fma(ZEXT416((uint)(local_a0.m_floats[0] * auVar13._0_4_)),
                                  ZEXT416((uint)local_a0.m_floats[1]),auVar26);
        fVar22 = local_11c * auVar25._0_4_;
        fVar2 = local_11c * auVar21._0_4_;
        fVar27 = local_11c * auVar13._0_4_;
        auVar21 = vinsertps_avx(ZEXT416((uint)(local_c4 + fVar22)),ZEXT416((uint)(local_c8 + fVar2))
                                ,0x10);
        local_88.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar21,ZEXT416((uint)(local_cc + fVar27)),0x28);
        auVar21 = vinsertps_avx(ZEXT416((uint)(local_c4 - fVar22)),ZEXT416((uint)(local_c8 - fVar2))
                                ,0x10);
        local_50.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar21,ZEXT416((uint)(local_cc - fVar27)),0x28);
        bVar15 = bt_utils::IntersectSegmentBox
                           (&local_40,&local_88,&local_a0,(cbtScalar)local_e8._0_4_,1e-05,&local_bc,
                            &local_c0);
        if (bVar15) {
          auVar21 = vminss_avx(local_e8,ZEXT416((uint)local_bc));
          uVar12 = vcmpss_avx512f(ZEXT416((uint)local_bc),local_b8,1);
          bVar15 = (bool)((byte)uVar12 & 1);
          local_120 = (float)((uint)bVar15 * local_b8._0_4_ + (uint)!bVar15 * auVar21._0_4_);
          if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_120);
          }
          else {
            *local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_120;
            local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          auVar21 = vminss_avx(local_e8,ZEXT416((uint)local_c0));
          uVar12 = vcmpss_avx512f(ZEXT416((uint)local_c0),local_b8,1);
          bVar15 = (bool)((byte)uVar12 & 1);
          local_120 = (float)((uint)bVar15 * local_b8._0_4_ + (uint)!bVar15 * auVar21._0_4_);
          if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_120);
          }
          else {
            *local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_120;
            local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        bVar15 = bt_utils::IntersectSegmentBox
                           (&local_40,&local_50,&local_a0,(cbtScalar)local_e8._0_4_,1e-05,&local_bc,
                            &local_c0);
        if (bVar15) {
          auVar21 = vminss_avx(local_e8,ZEXT416((uint)local_bc));
          uVar12 = vcmpss_avx512f(ZEXT416((uint)local_bc),local_b8,1);
          bVar15 = (bool)((byte)uVar12 & 1);
          local_120 = (float)((uint)bVar15 * local_b8._0_4_ + (uint)!bVar15 * auVar21._0_4_);
          if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_120);
          }
          else {
            *local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_120;
            local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          auVar21 = vminss_avx(local_e8,ZEXT416((uint)local_c0));
          uVar12 = vcmpss_avx512f(ZEXT416((uint)local_c0),local_b8,1);
          bVar15 = (bool)((byte)uVar12 & 1);
          local_120 = (float)((uint)bVar15 * local_b8._0_4_ + (uint)!bVar15 * auVar21._0_4_);
          if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_120);
          }
          else {
            *local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_120;
            local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      pfVar20 = local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pfVar14 = local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (int)LZCOUNT((long)local_118.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pfVar14,pfVar20);
    }
    pfVar14 = local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      fVar22 = (float)local_e8._0_4_ * -2.0;
      local_8c = local_11c * local_11c;
      pfVar20 = local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        fVar2 = *pfVar20;
        if (local_fc <= fVar2 - fVar22) {
          local_e8._0_4_ = fVar2;
          local_b8 = ZEXT416((uint)(fVar2 * local_a0.m_floats[0] + local_c4));
          local_68 = ZEXT416((uint)(fVar2 * local_a0.m_floats[1] + local_c8));
          auVar21 = vinsertps_avx(local_b8,local_68,0x10);
          local_78 = ZEXT416((uint)(fVar2 * local_a0.m_floats[2] + local_cc));
          local_f8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,local_78,0x28);
          bt_utils::SnapPointToBox(&local_40,&local_f8);
          fVar2 = (float)local_b8._0_4_ - local_f8.m_floats[0];
          fVar27 = (float)local_68._0_4_ - local_f8.m_floats[1];
          fVar4 = (float)local_78._0_4_ - local_f8.m_floats[2];
          auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar27)),ZEXT416((uint)fVar2),
                                    ZEXT416((uint)fVar2));
          auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
          fVar23 = auVar21._0_4_;
          fVar22 = (float)local_e8._0_4_;
          if ((fVar23 < local_8c) && (1e-12 < fVar23)) {
            if (fVar23 < 0.0) {
              local_b8._0_4_ = fVar2;
              local_68._0_4_ = fVar27;
              local_78._0_4_ = fVar4;
              fVar22 = sqrtf(fVar23);
              fVar27 = (float)local_68._0_4_;
              fVar2 = (float)local_b8._0_4_;
              fVar4 = (float)local_78._0_4_;
            }
            else {
              auVar21 = vsqrtss_avx(auVar21,auVar21);
              fVar22 = auVar21._0_4_;
            }
            fVar23 = 1.0 / fVar22;
            fVar2 = fVar2 * fVar23;
            fVar27 = fVar27 * fVar23;
            fVar4 = fVar4 * fVar23;
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (pcVar9->m_basis).m_el[0].m_floats[1])
                                             ),ZEXT416((uint)fVar2),
                                      ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[0]));
            auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)fVar4),
                                      ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[2]));
            fVar23 = (pcVar9->m_basis).m_el[1].m_floats[1];
            auVar26 = ZEXT416((uint)(pcVar9->m_basis).m_el[1].m_floats[0]);
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * fVar23)),auVar26,ZEXT416((uint)fVar2))
            ;
            auVar29 = ZEXT416((uint)(pcVar9->m_basis).m_el[1].m_floats[2]);
            auVar13 = vfmadd231ss_fma(auVar13,auVar29,ZEXT416((uint)fVar4));
            auVar21 = vinsertps_avx(auVar21,auVar13,0x10);
            fVar10 = (pcVar9->m_basis).m_el[2].m_floats[1];
            auVar28 = ZEXT416((uint)(pcVar9->m_basis).m_el[2].m_floats[0]);
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar27)),auVar28,ZEXT416((uint)fVar2))
            ;
            auVar25 = ZEXT416((uint)(pcVar9->m_basis).m_el[2].m_floats[2]);
            auVar13 = vfmadd231ss_fma(auVar13,auVar25,ZEXT416((uint)fVar4));
            local_88.m_floats = (cbtScalar  [4])vinsertps_avx(auVar21,auVar13,0x28);
            auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_f8.m_floats[1] *
                                                    (pcVar9->m_basis).m_el[0].m_floats[1])),
                                      ZEXT416((uint)local_f8.m_floats[0]),
                                      ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[0]));
            auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)local_f8.m_floats[2]),
                                      ZEXT416((uint)(pcVar9->m_basis).m_el[0].m_floats[2]));
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * local_f8.m_floats[1])),
                                      ZEXT416((uint)local_f8.m_floats[0]),auVar26);
            auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_f8.m_floats[2]),auVar29);
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_f8.m_floats[1])),
                                      ZEXT416((uint)local_f8.m_floats[0]),auVar28);
            auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)local_f8.m_floats[2]),auVar25);
            auVar21 = vinsertps_avx(ZEXT416((uint)(auVar21._0_4_ + (pcVar9->m_origin).m_floats[0])),
                                    ZEXT416((uint)(auVar13._0_4_ + (pcVar9->m_origin).m_floats[1])),
                                    0x10);
            local_50.m_floats =
                 (cbtScalar  [4])
                 vinsertps_avx(auVar21,ZEXT416((uint)(auVar26._0_4_ + (pcVar9->m_origin).m_floats[2]
                                                     )),0x28);
            (*(local_a8->super_Result)._vptr_Result[4])
                      ((ulong)(uint)(fVar22 - local_11c),local_a8,&local_88,&local_50);
            fVar22 = (float)local_e8._0_4_;
          }
        }
        pfVar20 = pfVar20 + 1;
      } while (pfVar20 != pfVar14);
    }
    if (((local_58->m_ownManifold != false) && (local_58->m_manifoldPtr->m_cachedPoints != 0)) &&
       (this_00 = local_a8->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar18 = local_a8->m_body0Wrap->m_collisionObject;
      if (this_00->m_body0 == pcVar18) {
        pcVar17 = local_a8->m_body1Wrap->m_collisionObject;
      }
      else {
        pcVar17 = pcVar18;
        pcVar18 = local_a8->m_body1Wrap->m_collisionObject;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar18->m_worldTransform,&pcVar17->m_worldTransform);
    }
    if (local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void cbtCapsuleBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0,
                                                       const cbtCollisionObjectWrapper* body1,
                                                       const cbtDispatcherInfo& dispatchInfo,
                                                       cbtManifoldResult* resultOut) {
    (void)dispatchInfo;
    (void)resultOut;
    if (!m_manifoldPtr)
        return;

    const cbtCollisionObjectWrapper* capObjWrap = m_isSwapped ? body1 : body0;
    const cbtCollisionObjectWrapper* boxObjWrap = m_isSwapped ? body0 : body1;

    resultOut->setPersistentManifold(m_manifoldPtr);

    const cbtCapsuleShape* cap = (cbtCapsuleShape*)capObjWrap->getCollisionShape();
    const cbtBoxShape* box = (cbtBoxShape*)boxObjWrap->getCollisionShape();

    // Express capsule in the box frame
    const cbtTransform& abs_X_cap = capObjWrap->getWorldTransform();
    const cbtTransform& abs_X_box = boxObjWrap->getWorldTransform();
    cbtTransform box_X_cap = abs_X_box.inverseTimes(abs_X_cap);

    cbtVector3 a = box_X_cap.getBasis().getColumn(1);  // capsule axis (expressed in box frame)
    cbtVector3 c = box_X_cap.getOrigin();              // capsule center (expressed in box frame)

    // Box dimensions
    cbtVector3 hdims = box->getHalfExtentsWithMargin();

    // Cylinder dimensions
    cbtScalar radius = cap->getRadius();    // capsule radius
    cbtScalar hlen = cap->getHalfHeight();  // capsule half-length

    // Loop over each direction of the box frame (i.e., each of the 3 face normals).
    // In each case, consider two segments on the cylindrical surface that are on a plane defined by the axis and the
    // face normal. (Note that, in principle, we could only consider the segment "closest" to the box, but that is not
    // trivial to define in all configurations). Such segments are parameterized by t in [-H,H].
    //
    // Consider (at most) 4 candidate points on each segment: the 2 ends of the segment and the intersections of the
    // segment with the box (if such an intersection exists).
    //
    // For a capsule, projects these points back onto the capsule axis and check intersection between spheres centered
    // at the points on the axis and the box.  In this case, the projection is done orthogonal to the capsule axis.

    const cbtScalar parallel_tol = cbtScalar(1e-5);           // tolearance for parallelism tests
    const cbtScalar near_tol = cbtScalar(1e-4) * (2 * hlen);  // tolerance for line parameters of near duplicate points

    std::vector<cbtScalar> t_points = {-hlen, +hlen};  // initialize list of candidates with segment ends

    for (int i = 0; i < 3; i++) {
        // "positive" face normal
        cbtVector3 n(0, 0, 0);
        n[i] = 1;

        // If the axis is parallel to the face normal, no additional candidate point.
        cbtVector3 v = n.cross(a);
        if (std::abs(a[i] - 1) < parallel_tol)
            continue;

        // Direction perpendicular to axis
        cbtVector3 r = v.cross(a);

        // Construct center points of the two segments on cylindrical surface
        cbtVector3 c1 = c + radius * r;
        cbtVector3 c2 = c - radius * r;

        // Check if either segment intersects box.
        // If it does, append line parameters for intersection points (clamped to segment limits).
        cbtScalar tMin;
        cbtScalar tMax;
        if (bt_utils::IntersectSegmentBox(hdims, c1, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
        if (bt_utils::IntersectSegmentBox(hdims, c2, a, hlen, parallel_tol, tMin, tMax)) {
            t_points.push_back(ChClamp(tMin, -hlen, +hlen));
            t_points.push_back(ChClamp(tMax, -hlen, +hlen));
        }
    }

    // Contact distance
    cbtScalar contactDist = radius;
    ////cbtScalar contactDist = radius + m_manifoldPtr->getContactBreakingThreshold();

    // Loop over all candidate points (points on the capsule axis) and perform a sphere-box collision test.
    // In order to eliminate near duplicate points, use a sorted list and keep track of last processed point.
    std::sort(t_points.begin(), t_points.end());
    cbtScalar t_last = -2 * hlen;
    int n_contacts = 0;
    for (auto t : t_points) {
        if (t - t_last < near_tol)
            continue;

        // Update last processed point
        t_last = t;

        // Calculate sphere center (point on axis, expressed in box frame) and snap it to the surface of the box
        cbtVector3 sphPos = c + a * t;
        cbtVector3 boxPos = sphPos;
        bt_utils::SnapPointToBox(hdims, boxPos);

        // If the distance from the sphere center to the closest point is larger than the radius plus the separation
        // value, then there is no contact. Also, ignore contact if the sphere center (almost) coincides with the
        // closest point, in which case we couldn't decide on the proper contact direction.
        cbtVector3 delta = sphPos - boxPos;
        cbtScalar dist2 = delta.length2();
        if (dist2 >= contactDist * contactDist || dist2 <= 1e-12)
            continue;

        // Generate contact information (transform to absolute frame)
        cbtScalar dist = cbtSqrt(dist2);
        cbtScalar penetration = dist - radius;
        cbtVector3 normal = abs_X_box.getBasis() * (delta / dist);
        cbtVector3 point = abs_X_box(boxPos);

        // A new contact point must specify:
        //   normal, pointing from B towards A
        //   point, located on surface of B
        //   distance, negative for penetration
        resultOut->addContactPoint(normal, point, penetration);
        n_contacts++;
    }

    if (m_ownManifold && m_manifoldPtr->getNumContacts()) {
        resultOut->refreshContactPoints();
    }
}